

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_type_enums
                 (lysc_ctx *ctx,lysp_type_enum *enums_p,LY_DATA_TYPE basetype,
                 lysc_type_bitenum_item *base_enums,lysc_type_bitenum_item **bitenums)

{
  lysc_type_bitenum_item *plVar1;
  bool bVar2;
  int iVar3;
  LY_ERR LVar4;
  ushort uVar5;
  char *pcVar6;
  undefined8 in_stack_fffffffffffffe58;
  undefined4 uVar7;
  long local_198;
  lysp_ext_instance *local_178;
  lysp_ext_instance *local_168;
  lysp_ext_instance *local_150;
  lysp_ext_instance *local_140;
  long local_120;
  long local_118;
  ulong local_110;
  ulong local_100;
  uint64_t local_f0;
  ulong local_e0;
  ulong local_d0;
  long *plStack_b8;
  LY_ERR ret__;
  char *p___1;
  uint64_t __u;
  char *p__;
  undefined1 local_98 [7];
  ly_bool enabled;
  lysc_type_bitenum_item storage;
  lysc_type_bitenum_item *e;
  uint32_t cur_pos;
  uint32_t highest_position;
  int32_t cur_val;
  int32_t highest_value;
  uint64_t match;
  uint64_t v;
  uint64_t u;
  LY_ERR ret;
  lysc_type_bitenum_item **bitenums_local;
  lysc_type_bitenum_item *base_enums_local;
  LY_DATA_TYPE basetype_local;
  lysp_type_enum *enums_p_local;
  lysc_ctx *ctx_local;
  
  u._4_4_ = LY_SUCCESS;
  _cur_val = 0;
  highest_position = 0x80000000;
  cur_pos = 0x80000000;
  e._4_4_ = 0;
  e._0_4_ = 0;
  if ((base_enums != (lysc_type_bitenum_item *)0x0) && (ctx->pmod->version < 2)) {
    pcVar6 = "Bits";
    if (basetype == LY_TYPE_ENUM) {
      pcVar6 = "Enumeration";
    }
    ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
            "%s type can be subtyped only in YANG 1.1 modules.",pcVar6);
    return LY_EVALID;
  }
  v = 0;
  while( true ) {
    if (enums_p == (lysp_type_enum *)0x0) {
      local_d0 = 0;
    }
    else {
      local_d0 = *(ulong *)&enums_p[-1].flags;
    }
    if (local_d0 <= v) {
      return u._4_4_;
    }
    if (base_enums != (lysc_type_bitenum_item *)0x0) {
      match = 0;
      while( true ) {
        if (base_enums == (lysc_type_bitenum_item *)0x0) {
          local_e0 = 0;
        }
        else {
          local_e0._0_4_ = base_enums[-1].field_4;
          local_e0._4_2_ = base_enums[-1].flags;
          local_e0._6_2_ = *(undefined2 *)&base_enums[-1].field_0x26;
        }
        if ((local_e0 <= match) ||
           (iVar3 = strcmp(enums_p[v].name,base_enums[match].name), iVar3 == 0)) break;
        match = match + 1;
      }
      if (base_enums == (lysc_type_bitenum_item *)0x0) {
        local_f0 = 0;
      }
      else {
        local_f0._0_4_ = base_enums[-1].field_4;
        local_f0._4_2_ = base_enums[-1].flags;
        local_f0._6_2_ = *(undefined2 *)&base_enums[-1].field_0x26;
      }
      if (match == local_f0) {
        pcVar6 = "bits";
        if (basetype == LY_TYPE_ENUM) {
          pcVar6 = "enumeration";
        }
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid %s - derived type adds new item \"%s\".",pcVar6,enums_p[v].name);
        return LY_EVALID;
      }
      _cur_val = match;
    }
    if (basetype == LY_TYPE_ENUM) {
      if ((enums_p[v].flags & 0x200) == 0) {
        if (base_enums == (lysc_type_bitenum_item *)0x0) {
          if (v == 0) {
            cur_pos = 0;
          }
          else {
            if (highest_position == 0x7fffffff) {
              ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid enumeration - it is not possible to auto-assign enum value for \"%s\" since the highest value is already 2147483647."
                      ,enums_p[v].name);
              return LY_EVALID;
            }
            cur_pos = highest_position + 1;
          }
        }
        else {
          cur_pos = base_enums[_cur_val].field_4.position;
        }
      }
      else {
        cur_pos = (uint32_t)enums_p[v].value;
        match = 0;
        while( true ) {
          if (*bitenums == (lysc_type_bitenum_item *)0x0) {
            local_100 = 0;
          }
          else {
            plVar1 = *bitenums;
            local_100._0_4_ = plVar1[-1].field_4;
            local_100._4_2_ = plVar1[-1].flags;
            local_100._6_2_ = *(undefined2 *)&plVar1[-1].field_0x26;
          }
          if (local_100 <= match) break;
          if (cur_pos == (*bitenums)[match].field_4.value) {
            ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid enumeration - value %d collide in items \"%s\" and \"%s\".",
                    enums_p[v].value & 0xffffffff,enums_p[v].name,(*bitenums)[match].name);
            return LY_EVALID;
          }
          match = match + 1;
        }
      }
      if ((int)highest_position < (int)cur_pos) {
        highest_position = cur_pos;
      }
    }
    else {
      if ((enums_p[v].flags & 0x200) == 0) {
        if (base_enums == (lysc_type_bitenum_item *)0x0) {
          if (v == 0) {
            e._0_4_ = 0;
          }
          else {
            if (e._4_4_ == 0xffffffff) {
              ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid bits - it is not possible to auto-assign bit position for \"%s\" since the highest value is already 4294967295."
                      ,enums_p[v].name);
              return LY_EVALID;
            }
            e._0_4_ = e._4_4_ + 1;
          }
        }
        else {
          e._0_4_ = base_enums[_cur_val].field_4.position;
        }
      }
      else {
        e._0_4_ = (uint32_t)enums_p[v].value;
        match = 0;
        while( true ) {
          if (*bitenums == (lysc_type_bitenum_item *)0x0) {
            local_110 = 0;
          }
          else {
            plVar1 = *bitenums;
            local_110._0_4_ = plVar1[-1].field_4;
            local_110._4_2_ = plVar1[-1].flags;
            local_110._6_2_ = *(undefined2 *)&plVar1[-1].field_0x26;
          }
          if (local_110 <= match) break;
          if ((uint32_t)e == (*bitenums)[match].field_4.value) {
            ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid bits - position %u collide in items \"%s\" and \"%s\".",
                    enums_p[v].value & 0xffffffff,enums_p[v].name,(*bitenums)[match].name);
            return LY_EVALID;
          }
          match = match + 1;
        }
      }
      if (e._4_4_ < (uint32_t)e) {
        e._4_4_ = (uint32_t)e;
      }
    }
    if (base_enums != (lysc_type_bitenum_item *)0x0) {
      uVar7 = (undefined4)((ulong)in_stack_fffffffffffffe58 >> 0x20);
      if (basetype == LY_TYPE_ENUM) {
        if (cur_pos != base_enums[_cur_val].field_4.value) {
          ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid enumeration - value of the item \"%s\" has changed from %d to %d in the derived type."
                  ,enums_p[v].name,(ulong)base_enums[_cur_val].field_4.position,
                  CONCAT44(uVar7,cur_pos));
          return LY_EVALID;
        }
      }
      else if ((uint32_t)e != base_enums[_cur_val].field_4.value) {
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid bits - position of the item \"%s\" has changed from %u to %u in the derived type."
                ,enums_p[v].name,(ulong)base_enums[_cur_val].field_4.position,
                CONCAT44(uVar7,(uint32_t)e));
        return LY_EVALID;
      }
    }
    if (*bitenums == (lysc_type_bitenum_item *)0x0) {
      __u = (uint64_t)malloc(0x30);
      if ((undefined8 *)__u == (undefined8 *)0x0) {
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_enums"
              );
        return LY_EMEM;
      }
      *(undefined8 *)__u = 1;
    }
    else {
      *(long *)&(*bitenums)[-1].field_4 = *(long *)&(*bitenums)[-1].field_4 + 1;
      __u = (uint64_t)realloc(&(*bitenums)[-1].field_4,*(long *)&(*bitenums)[-1].field_4 * 0x28 + 8)
      ;
      if ((void *)__u == (void *)0x0) {
        *(long *)&(*bitenums)[-1].field_4 = *(long *)&(*bitenums)[-1].field_4 + -1;
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_enums"
              );
        return LY_EMEM;
      }
    }
    *bitenums = (lysc_type_bitenum_item *)(__u + 8);
    storage._32_8_ = *bitenums + *(long *)&(*bitenums)[-1].field_4 + -1;
    memset((void *)storage._32_8_,0,0x28);
    LVar4 = lydict_dup(ctx->ctx,enums_p[v].name,(char **)storage._32_8_);
    if (LVar4 != LY_SUCCESS) break;
    LVar4 = lydict_dup(ctx->ctx,enums_p[v].dsc,(char **)(storage._32_8_ + 8));
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    LVar4 = lydict_dup(ctx->ctx,enums_p[v].ref,(char **)(storage._32_8_ + 0x10));
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    uVar5 = 0;
    if (basetype == LY_TYPE_ENUM) {
      uVar5 = 0x200;
    }
    *(uint16_t *)(storage._32_8_ + 0x24) = enums_p[v].flags & 0xff | uVar5;
    if (basetype == LY_TYPE_ENUM) {
      *(uint32_t *)(storage._32_8_ + 0x20) = cur_pos;
    }
    else {
      *(uint32_t *)(storage._32_8_ + 0x20) = (uint32_t)e;
    }
    u._4_4_ = LY_SUCCESS;
    if (enums_p[v].exts != (lysp_ext_instance *)0x0) {
      if (*(long *)(storage._32_8_ + 0x18) == 0) {
        local_120 = 0;
      }
      else {
        if (*(long *)(storage._32_8_ + 0x18) == 0) {
          local_118 = 0;
        }
        else {
          local_118 = *(long *)(*(long *)(storage._32_8_ + 0x18) + -8);
        }
        local_120 = local_118;
      }
      if (*(long *)(storage._32_8_ + 0x18) == 0) {
        if (enums_p[v].exts == (lysp_ext_instance *)0x0) {
          local_150 = (lysp_ext_instance *)0x0;
        }
        else {
          local_150 = enums_p[v].exts[-1].exts;
        }
        plStack_b8 = (long *)calloc(1,((long)&local_150->name + local_120) * 0x48 + 8);
        if (plStack_b8 == (long *)0x0) {
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_type_enums");
          return LY_EMEM;
        }
      }
      else {
        if (enums_p[v].exts == (lysp_ext_instance *)0x0) {
          local_140 = (lysp_ext_instance *)0x0;
        }
        else {
          local_140 = enums_p[v].exts[-1].exts;
        }
        plStack_b8 = (long *)realloc((void *)(*(long *)(storage._32_8_ + 0x18) + -8),
                                     ((long)&local_140->name +
                                     *(long *)(*(long *)(storage._32_8_ + 0x18) + -8) + local_120) *
                                     0x48 + 8);
        if (plStack_b8 == (long *)0x0) {
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_type_enums");
          return LY_EMEM;
        }
      }
      *(long **)(storage._32_8_ + 0x18) = plStack_b8 + 1;
      if (*(long *)(storage._32_8_ + 0x18) != 0) {
        if (enums_p[v].exts == (lysp_ext_instance *)0x0) {
          local_168 = (lysp_ext_instance *)0x0;
        }
        else {
          local_168 = enums_p[v].exts[-1].exts;
        }
        memset((void *)(*(long *)(storage._32_8_ + 0x18) + *plStack_b8 * 0x48),0,
               ((long)&local_168->name + local_120) * 0x48);
      }
      p___1 = (char *)0x0;
      while( true ) {
        if (enums_p[v].exts == (lysp_ext_instance *)0x0) {
          local_178 = (lysp_ext_instance *)0x0;
        }
        else {
          local_178 = enums_p[v].exts[-1].exts;
        }
        if (local_178 <= p___1) break;
        *(long *)(*(long *)(storage._32_8_ + 0x18) + -8) =
             *(long *)(*(long *)(storage._32_8_ + 0x18) + -8) + 1;
        if (*(long *)(storage._32_8_ + 0x18) == 0) {
          local_198 = 0;
        }
        else {
          local_198 = *(long *)(*(long *)(storage._32_8_ + 0x18) + -8);
        }
        u._4_4_ = lys_compile_ext(ctx,enums_p[v].exts + (long)p___1,
                                  (lysc_ext_instance *)
                                  (*(long *)(storage._32_8_ + 0x18) + (local_198 + -1) * 0x48),
                                  (void *)storage._32_8_);
        if (u._4_4_ == LY_ENOT) {
          *(long *)(*(long *)(storage._32_8_ + 0x18) + -8) =
               *(long *)(*(long *)(storage._32_8_ + 0x18) + -8) + -1;
          u._4_4_ = LY_SUCCESS;
        }
        else if (u._4_4_ != LY_SUCCESS) {
          return u._4_4_;
        }
        p___1 = p___1 + 1;
      }
    }
    LVar4 = lys_eval_iffeatures(ctx->ctx,enums_p[v].iffeatures,(ly_bool *)((long)&p__ + 7));
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    if (p__._7_1_ == '\0') {
      *(ushort *)(storage._32_8_ + 0x24) = *(ushort *)(storage._32_8_ + 0x24) | 0x100;
    }
    if (basetype == LY_TYPE_BITS) {
      match = v;
      while( true ) {
        bVar2 = false;
        if (match != 0) {
          bVar2 = *(uint *)(storage._32_8_ + 0x20) < (*bitenums)[match - 1].field_4.position;
        }
        if (!bVar2) break;
        match = match - 1;
      }
      if (match != v) {
        memcpy(local_98,(void *)storage._32_8_,0x28);
        memmove(*bitenums + match + 1,*bitenums + match,(v - match) * 0x28);
        memcpy(*bitenums + match,local_98,0x28);
      }
    }
    v = v + 1;
  }
  return LVar4;
}

Assistant:

LY_ERR
lys_compile_type_enums(struct lysc_ctx *ctx, const struct lysp_type_enum *enums_p, LY_DATA_TYPE basetype,
        struct lysc_type_bitenum_item *base_enums, struct lysc_type_bitenum_item **bitenums)
{
    LY_ERR ret = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u, v, match = 0;
    int32_t highest_value = INT32_MIN, cur_val = INT32_MIN;
    uint32_t highest_position = 0, cur_pos = 0;
    struct lysc_type_bitenum_item *e, storage;
    ly_bool enabled;

    if (base_enums && (ctx->pmod->version < LYS_VERSION_1_1)) {
        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG, "%s type can be subtyped only in YANG 1.1 modules.",
                basetype == LY_TYPE_ENUM ? "Enumeration" : "Bits");
        return LY_EVALID;
    }

    LY_ARRAY_FOR(enums_p, u) {
        /* perform all checks */
        if (base_enums) {
            /* check the enum/bit presence in the base type - the set of enums/bits in the derived type must be a subset */
            LY_ARRAY_FOR(base_enums, v) {
                if (!strcmp(enums_p[u].name, base_enums[v].name)) {
                    break;
                }
            }
            if (v == LY_ARRAY_COUNT(base_enums)) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s - derived type adds new item \"%s\".",
                        basetype == LY_TYPE_ENUM ? "enumeration" : "bits", enums_p[u].name);
                return LY_EVALID;
            }
            match = v;
        }

        if (basetype == LY_TYPE_ENUM) {
            if (enums_p[u].flags & LYS_SET_VALUE) {
                /* value assigned by model */
                cur_val = (int32_t)enums_p[u].value;
                /* check collision with other values */
                LY_ARRAY_FOR(*bitenums, v) {
                    if (cur_val == (*bitenums)[v].value) {
                        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                                "Invalid enumeration - value %" PRId32 " collide in items \"%s\" and \"%s\".",
                                cur_val, enums_p[u].name, (*bitenums)[v].name);
                        return LY_EVALID;
                    }
                }
            } else if (base_enums) {
                /* inherit the assigned value */
                cur_val = base_enums[match].value;
            } else {
                /* assign value automatically */
                if (u == 0) {
                    cur_val = 0;
                } else if (highest_value == INT32_MAX) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid enumeration - it is not possible to auto-assign enum value for "
                            "\"%s\" since the highest value is already 2147483647.", enums_p[u].name);
                    return LY_EVALID;
                } else {
                    cur_val = highest_value + 1;
                }
            }

            /* save highest value for auto assing */
            if (highest_value < cur_val) {
                highest_value = cur_val;
            }
        } else { /* LY_TYPE_BITS */
            if (enums_p[u].flags & LYS_SET_VALUE) {
                /* value assigned by model */
                cur_pos = (uint32_t)enums_p[u].value;
                /* check collision with other values */
                LY_ARRAY_FOR(*bitenums, v) {
                    if (cur_pos == (*bitenums)[v].position) {
                        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                                "Invalid bits - position %" PRIu32 " collide in items \"%s\" and \"%s\".",
                                cur_pos, enums_p[u].name, (*bitenums)[v].name);
                        return LY_EVALID;
                    }
                }
            } else if (base_enums) {
                /* inherit the assigned value */
                cur_pos = base_enums[match].position;
            } else {
                /* assign value automatically */
                if (u == 0) {
                    cur_pos = 0;
                } else if (highest_position == UINT32_MAX) {
                    /* counter overflow */
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid bits - it is not possible to auto-assign bit position for "
                            "\"%s\" since the highest value is already 4294967295.", enums_p[u].name);
                    return LY_EVALID;
                } else {
                    cur_pos = highest_position + 1;
                }
            }

            /* save highest position for auto assing */
            if (highest_position < cur_pos) {
                highest_position = cur_pos;
            }
        }

        /* the assigned values must not change from the derived type */
        if (base_enums) {
            if (basetype == LY_TYPE_ENUM) {
                if (cur_val != base_enums[match].value) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid enumeration - value of the item \"%s\" has changed from %" PRId32 " to %" PRId32
                            " in the derived type.", enums_p[u].name, base_enums[match].value, cur_val);
                    return LY_EVALID;
                }
            } else {
                if (cur_pos != base_enums[match].position) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid bits - position of the item \"%s\" has changed from %" PRIu32 " to %" PRIu32
                            " in the derived type.", enums_p[u].name, base_enums[match].position, cur_pos);
                    return LY_EVALID;
                }
            }
        }

        /* add new enum/bit */
        LY_ARRAY_NEW_RET(ctx->ctx, *bitenums, e, LY_EMEM);
        DUP_STRING_GOTO(ctx->ctx, enums_p[u].name, e->name, ret, done);
        DUP_STRING_GOTO(ctx->ctx, enums_p[u].dsc, e->dsc, ret, done);
        DUP_STRING_GOTO(ctx->ctx, enums_p[u].ref, e->ref, ret, done);
        e->flags = (enums_p[u].flags & LYS_FLAGS_COMPILED_MASK) | (basetype == LY_TYPE_ENUM ? LYS_IS_ENUM : 0);
        if (basetype == LY_TYPE_ENUM) {
            e->value = cur_val;
        } else {
            e->position = cur_pos;
        }
        COMPILE_EXTS_GOTO(ctx, enums_p[u].exts, e->exts, e, ret, done);

        /* evaluate if-ffeatures */
        LY_CHECK_RET(lys_eval_iffeatures(ctx->ctx, enums_p[u].iffeatures, &enabled));
        if (!enabled) {
            /* set only flag, later resolved and removed */
            e->flags |= LYS_DISABLED;
        }

        if (basetype == LY_TYPE_BITS) {
            /* keep bits ordered by position */
            for (v = u; v && (*bitenums)[v - 1].position > e->position; --v) {}
            if (v != u) {
                memcpy(&storage, e, sizeof *e);
                memmove(&(*bitenums)[v + 1], &(*bitenums)[v], (u - v) * sizeof **bitenums);
                memcpy(&(*bitenums)[v], &storage, sizeof storage);
            }
        }
    }

done:
    return ret;
}